

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O2

void __thiscall
glslang::TIntermediate::mergeUniformObjects
          (TIntermediate *this,TInfoSink *infoSink,TIntermediate *unit)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  TIntermAggregate *pTVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  _Iter_pred<glslang::TIntermediate::mergeUniformObjects(TInfoSink&,glslang::TIntermediate&)::__0>
  *p_Var6;
  _Iter_pred<glslang::TIntermediate::mergeUniformObjects(TInfoSink&,glslang::TIntermediate&)::__0>
  *p_Var7;
  long lVar8;
  _Iter_pred<glslang::TIntermediate::mergeUniformObjects(TInfoSink&,glslang::TIntermediate&)::__0>
  *p_Var9;
  TIntermSequence unitLinkerObjects;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> local_50;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  __it;
  
  if (unit->treeRoot == (TIntermNode *)0x0) {
    return;
  }
  if (this->treeRoot == (TIntermNode *)0x0) {
    return;
  }
  pTVar4 = findLinkerObjects(this);
  iVar2 = (*(pTVar4->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x32])(pTVar4);
  pTVar4 = findLinkerObjects(unit);
  iVar3 = (*(pTVar4->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x32])(pTVar4);
  __it._M_current = (TIntermNode **)CONCAT44(extraout_var_00,iVar3);
  std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::vector
            (&local_50,
             (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)__it._M_current);
  lVar5 = (long)local_50.super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_50.super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
  p_Var7 = (_Iter_pred<glslang::TIntermediate::mergeUniformObjects(TInfoSink&,glslang::TIntermediate&)::__0>
            *)local_50.super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
  for (lVar8 = lVar5 >> 5; p_Var6 = p_Var7,
      p_Var9 = (_Iter_pred<glslang::TIntermediate::mergeUniformObjects(TInfoSink&,glslang::TIntermediate&)::__0>
                *)local_50.
                  super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl
                  .super__Vector_impl_data._M_finish, 0 < lVar8; lVar8 = lVar8 + -1) {
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<glslang::TIntermediate::mergeUniformObjects(TInfoSink&,glslang::TIntermediate&)::$_0>
            ::operator()(p_Var7,__it);
    if (bVar1) goto LAB_003736a4;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<glslang::TIntermediate::mergeUniformObjects(TInfoSink&,glslang::TIntermediate&)::$_0>
            ::operator()(p_Var7 + 8,__it);
    p_Var6 = p_Var7 + 8;
    if (bVar1) goto LAB_003736a4;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<glslang::TIntermediate::mergeUniformObjects(TInfoSink&,glslang::TIntermediate&)::$_0>
            ::operator()(p_Var7 + 0x10,__it);
    p_Var6 = p_Var7 + 0x10;
    if (bVar1) goto LAB_003736a4;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<glslang::TIntermediate::mergeUniformObjects(TInfoSink&,glslang::TIntermediate&)::$_0>
            ::operator()(p_Var7 + 0x18,__it);
    p_Var6 = p_Var7 + 0x18;
    if (bVar1) goto LAB_003736a4;
    p_Var7 = p_Var7 + 0x20;
    lVar5 = lVar5 + -0x20;
  }
  lVar5 = lVar5 >> 3;
  if (lVar5 == 1) {
LAB_0037368a:
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<glslang::TIntermediate::mergeUniformObjects(TInfoSink&,glslang::TIntermediate&)::$_0>
            ::operator()(p_Var7,__it);
    p_Var6 = p_Var7;
    if (!bVar1) {
      p_Var6 = (_Iter_pred<glslang::TIntermediate::mergeUniformObjects(TInfoSink&,glslang::TIntermediate&)::__0>
                *)local_50.
                  super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl
                  .super__Vector_impl_data._M_finish;
    }
  }
  else if (lVar5 == 2) {
LAB_0037367a:
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<glslang::TIntermediate::mergeUniformObjects(TInfoSink&,glslang::TIntermediate&)::$_0>
            ::operator()(p_Var7,__it);
    p_Var6 = p_Var7;
    if (!bVar1) {
      p_Var7 = p_Var7 + 8;
      goto LAB_0037368a;
    }
  }
  else {
    if (lVar5 != 3) goto LAB_003736d1;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<glslang::TIntermediate::mergeUniformObjects(TInfoSink&,glslang::TIntermediate&)::$_0>
            ::operator()(p_Var7,__it);
    if (!bVar1) {
      p_Var7 = p_Var7 + 8;
      goto LAB_0037367a;
    }
  }
LAB_003736a4:
  p_Var7 = p_Var6;
  if (p_Var6 != (_Iter_pred<glslang::TIntermediate::mergeUniformObjects(TInfoSink&,glslang::TIntermediate&)::__0>
                 *)local_50.
                   super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish) {
    while (p_Var7 = p_Var7 + 8, p_Var9 = p_Var6,
          p_Var7 != (_Iter_pred<glslang::TIntermediate::mergeUniformObjects(TInfoSink&,glslang::TIntermediate&)::__0>
                     *)local_50.
                       super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish) {
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<glslang::TIntermediate::mergeUniformObjects(TInfoSink&,glslang::TIntermediate&)::$_0>
              ::operator()(p_Var7,__it);
      if (!bVar1) {
        *(undefined8 *)p_Var6 = *(undefined8 *)p_Var7;
        p_Var6 = p_Var6 + 8;
      }
    }
  }
LAB_003736d1:
  std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::resize
            (&local_50,
             (long)p_Var9 -
             (long)local_50.
                   super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3);
  mergeGlobalUniformBlocks(this,infoSink,unit,false);
  mergeLinkerObjects(this,infoSink,(TIntermSequence *)CONCAT44(extraout_var,iVar2),
                     (TIntermSequence *)&local_50,unit->language);
  return;
}

Assistant:

void TIntermediate::mergeUniformObjects(TInfoSink& infoSink, TIntermediate& unit) {
    if (unit.treeRoot == nullptr || treeRoot == nullptr)
        return;

    // Get the linker-object lists
    TIntermSequence& linkerObjects = findLinkerObjects()->getSequence();
    TIntermSequence unitLinkerObjects = unit.findLinkerObjects()->getSequence();

    // filter unitLinkerObjects to only contain uniforms
    auto end = std::remove_if(unitLinkerObjects.begin(), unitLinkerObjects.end(),
        [](TIntermNode* node) {return node->getAsSymbolNode()->getQualifier().storage != EvqUniform &&
                                      node->getAsSymbolNode()->getQualifier().storage != EvqBuffer; });
    unitLinkerObjects.resize(end - unitLinkerObjects.begin());

    // merge uniforms and do error checking
    bool mergeExistingOnly = false;
    mergeGlobalUniformBlocks(infoSink, unit, mergeExistingOnly);
    mergeLinkerObjects(infoSink, linkerObjects, unitLinkerObjects, unit.getStage());
}